

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffdelt(fitsfile *fptr,int *status)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *infilex;
  FITSfile *pFVar3;
  long lVar4;
  int *status_00;
  int zerostatus;
  int tstatus;
  int local_30 [2];
  
  local_30[1] = 999;
  local_30[0] = 0;
  if (fptr == (fitsfile *)0x0) {
    *status = 0x73;
    iVar1 = 0x73;
  }
  else if (fptr->Fptr->validcode == 0x22b) {
    status_00 = status;
    if (0 < *status) {
      status_00 = local_30 + 1;
    }
    ffchdu(fptr,status_00);
    ffflsh(fptr,1,status);
    iVar1 = (*driverTable[fptr->Fptr->driver].close)(fptr->Fptr->filehandle);
    if ((iVar1 != 0) && (*status < 1)) {
      *status = 0x6e;
      ffpmsg("failed to close the following file: (ffdelt)");
      ffpmsg(fptr->Fptr->filename);
    }
    pFVar3 = fptr->Fptr;
    if (driverTable[pFVar3->driver].remove != (_func_int_char_ptr *)0x0) {
      __s = pFVar3->filename;
      sVar2 = strlen(__s);
      infilex = (char *)malloc((long)((int)sVar2 + 1));
      if (infilex == (char *)0x0) {
        *status = 0x71;
        return 0x71;
      }
      ffifile2(__s,(char *)0x0,infilex,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0,(char *)0x0,local_30);
      iVar1 = (*driverTable[fptr->Fptr->driver].remove)(infilex);
      if (iVar1 != 0) {
        ffpmsg("failed to delete the following file: (ffdelt)");
        ffpmsg(fptr->Fptr->filename);
        if (*status == 0) {
          *status = 0x6e;
        }
      }
      free(infilex);
      pFVar3 = fptr->Fptr;
    }
    lVar4 = 0;
    do {
      if (*(FITSfile **)((long)FptrTable + lVar4) == pFVar3) {
        *(undefined8 *)((long)FptrTable + lVar4) = 0;
        pFVar3 = fptr->Fptr;
        break;
      }
      lVar4 = lVar4 + 8;
    } while (lVar4 != 80000);
    free(pFVar3->iobuffer);
    free(fptr->Fptr->headstart);
    free(fptr->Fptr->filename);
    free(fptr->Fptr);
    free(fptr);
    iVar1 = *status;
  }
  else {
    *status = 0x72;
    iVar1 = 0x72;
  }
  return iVar1;
}

Assistant:

int ffdelt(fitsfile *fptr,      /* I - FITS file pointer */
           int *status)         /* IO - error status     */
/*
  close and DELETE the FITS file. 
*/
{
    char *basename;
    int slen, tstatus = NO_CLOSE_ERROR, zerostatus = 0;

    if (!fptr)
        return(*status = NULL_INPUT_PTR);
    else if ((fptr->Fptr)->validcode != VALIDSTRUC) /* check for magic value */
        return(*status = BAD_FILEPTR); 

    if (*status > 0)
       ffchdu(fptr, &tstatus);  /* turn off the error message from ffchdu */
    else
        ffchdu(fptr, status);  

    ffflsh(fptr, TRUE, status);     /* flush and disassociate IO buffers */

        /* call driver function to actually close the file */
    if ( (*driverTable[(fptr->Fptr)->driver].close)((fptr->Fptr)->filehandle) )
    {
        if (*status <= 0)
        {
            *status = FILE_NOT_CLOSED;  /* report error if no previous error */

            ffpmsg("failed to close the following file: (ffdelt)");
            ffpmsg((fptr->Fptr)->filename);
        }
    }

    /* call driver function to actually delete the file */
    if ( (driverTable[(fptr->Fptr)->driver].remove) )
    {
        /* parse the input URL to get the base filename */
        slen = strlen((fptr->Fptr)->filename);
        basename = (char *) malloc(slen +1);
        if (!basename)
            return(*status = MEMORY_ALLOCATION);
    
        fits_parse_input_url((fptr->Fptr)->filename, NULL, basename, NULL, NULL, NULL, NULL,
               NULL, &zerostatus);

       if ((*driverTable[(fptr->Fptr)->driver].remove)(basename))
        {
            ffpmsg("failed to delete the following file: (ffdelt)");
            ffpmsg((fptr->Fptr)->filename);
            if (!(*status))
                *status = FILE_NOT_CLOSED;
        }
        free(basename);
    }

    fits_clear_Fptr( fptr->Fptr, status);  /* clear Fptr address */
    free((fptr->Fptr)->iobuffer);    /* free memory for I/O buffers */
    free((fptr->Fptr)->headstart);    /* free memory for headstart array */
    free((fptr->Fptr)->filename);     /* free memory for the filename */
    (fptr->Fptr)->filename = 0;
    (fptr->Fptr)->validcode = 0;      /* magic value to indicate invalid fptr */
    free(fptr->Fptr);              /* free memory for the FITS file structure */
    free(fptr);                    /* free memory for the FITS file structure */

    return(*status);
}